

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_2_5::CompositeDeepScanLine::Data::handleDeepFrameBuffer
          (Data *this,DeepFrameBuffer *buf,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *counts,
          vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
          *pointers,Header *header,int start,int end)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  double in_RSI;
  char *in_RDI;
  int in_R9D;
  int in_stack_00000008;
  int channel_in_source;
  DeepSlice *in_stack_000000b0;
  char *in_stack_000000b8;
  ConstIterator qt;
  size_t i;
  size_t pixelcount;
  ptrdiff_t width;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  double in_stack_fffffffffffffe28;
  vector<float_*,_std::allocator<float_*>_> *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined2 uVar9;
  double dVar8;
  double in_stack_fffffffffffffe40;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  *spst;
  double yst;
  double xst;
  const_iterator in_stack_fffffffffffffe68;
  PixelType t;
  DeepSlice *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  size_type local_130;
  Slice local_80;
  long local_48;
  int local_40;
  long local_38;
  int local_2c;
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  double local_10;
  
  uVar9 = (undefined2)((ulong)in_stack_fffffffffffffe38 >> 0x30);
  local_2c = in_R9D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_38 = (long)(local_40 + 1);
  local_48 = local_38 * ((in_stack_00000008 - local_2c) + 1);
  spst = local_20;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RDI + 0xb0));
  std::
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  ::resize((vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
            *)in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe30,
             (size_type)in_stack_fffffffffffffe28);
  yst = local_10;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_18,0);
  uVar7 = 0;
  Slice::Slice(&local_80,UINT,
               (char *)(pvVar3 + (-(long)*(int *)(in_RDI + 0x98) - local_2c * local_38)),4,
               local_38 << 2,1,1,0.0,false,false);
  DeepFrameBuffer::insertSampleCountSlice
            ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (Slice *)CONCAT44(in_stack_fffffffffffffe1c,uVar7));
  std::
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  ::operator[](local_20,0);
  std::vector<float_*,_std::allocator<float_*>_>::resize
            (in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
  xst = local_10;
  pvVar4 = std::
           vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
           ::operator[](local_20,0);
  std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar4,0);
  DeepSlice::DeepSlice
            (in_stack_fffffffffffffe70,(PixelType)((ulong)in_stack_fffffffffffffe68._M_node >> 0x20)
             ,in_RDI,(size_t)xst,(size_t)yst,(size_t)spst,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe88,in_stack_fffffffffffffe40,SUB21((ushort)uVar9 >> 8,0),
             SUB21(uVar9,0));
  DeepFrameBuffer::insert((DeepFrameBuffer *)qt._i._M_node,in_stack_000000b8,in_stack_000000b0);
  if ((in_RDI[0x60] & 1U) != 0) {
    std::
    vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
    ::operator[](local_20,1);
    std::vector<float_*,_std::allocator<float_*>_>::resize
              (in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe40 = local_10;
    pvVar4 = std::
             vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
             ::operator[](local_20,1);
    std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar4,0);
    DeepSlice::DeepSlice
              (in_stack_fffffffffffffe70,
               (PixelType)((ulong)in_stack_fffffffffffffe68._M_node >> 0x20),in_RDI,(size_t)xst,
               (size_t)yst,(size_t)spst,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffe40,SUB21((ushort)uVar9 >> 8,0),SUB21(uVar9,0));
    DeepFrameBuffer::insert((DeepFrameBuffer *)qt._i._M_node,in_stack_000000b8,in_stack_000000b0);
  }
  std::
  vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
  ::operator[](local_20,2);
  std::vector<float_*,_std::allocator<float_*>_>::resize
            (in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
  dVar8 = local_10;
  pvVar4 = std::
           vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
           ::operator[](local_20,2);
  std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar4,0);
  uVar7 = 1;
  uVar6 = 1;
  DeepSlice::DeepSlice
            (in_stack_fffffffffffffe70,(PixelType)((ulong)in_stack_fffffffffffffe68._M_node >> 0x20)
             ,in_RDI,(size_t)xst,(size_t)yst,(size_t)spst,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe88,in_stack_fffffffffffffe40,SUB81((ulong)dVar8 >> 0x38,0),
             SUB81((ulong)dVar8 >> 0x30,0));
  DeepFrameBuffer::insert((DeepFrameBuffer *)qt._i._M_node,in_stack_000000b8,in_stack_000000b0);
  local_130 = 0;
  FrameBuffer::begin((FrameBuffer *)CONCAT44(in_stack_fffffffffffffe0c,uVar7));
  FrameBuffer::ConstIterator::ConstIterator
            ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe14,uVar6),
             (Iterator *)CONCAT44(in_stack_fffffffffffffe0c,uVar7));
  while( true ) {
    t = (PixelType)((ulong)in_stack_fffffffffffffe68._M_node >> 0x20);
    FrameBuffer::end((FrameBuffer *)CONCAT44(in_stack_fffffffffffffe0c,uVar7));
    FrameBuffer::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe14,uVar6),
               (Iterator *)CONCAT44(in_stack_fffffffffffffe0c,uVar7));
    bVar2 = Imf_2_5::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffe14,uVar6),
                                (ConstIterator *)CONCAT44(in_stack_fffffffffffffe0c,uVar7));
    if (!bVar2) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 200),local_130);
    iVar1 = *pvVar5;
    if (2 < iVar1) {
      std::
      vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
      ::operator[](local_20,(long)iVar1);
      std::vector<float_*,_std::allocator<float_*>_>::resize
                (in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe28 = local_10;
      in_stack_fffffffffffffe30 =
           (vector<float_*,_std::allocator<float_*>_> *)
           FrameBuffer::ConstIterator::name((ConstIterator *)0x80fc90);
      pvVar4 = std::
               vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>
               ::operator[](local_20,(long)iVar1);
      std::vector<float_*,_std::allocator<float_*>_>::operator[](pvVar4,0);
      uVar7 = 1;
      uVar6 = 1;
      DeepSlice::DeepSlice
                (in_stack_fffffffffffffe70,t,in_RDI,(size_t)xst,(size_t)yst,(size_t)spst,
                 in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,in_stack_fffffffffffffe40,
                 SUB81((ulong)dVar8 >> 0x38,0),SUB81((ulong)dVar8 >> 0x30,0));
      DeepFrameBuffer::insert((DeepFrameBuffer *)qt._i._M_node,in_stack_000000b8,in_stack_000000b0);
    }
    local_130 = local_130 + 1;
    in_stack_fffffffffffffe68._M_node =
         (_Base_ptr)
         FrameBuffer::ConstIterator::operator++
                   ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe0c,uVar7),0);
  }
  return;
}

Assistant:

void 
CompositeDeepScanLine::Data::handleDeepFrameBuffer (DeepFrameBuffer& buf,
                                                    std::vector< unsigned int > & counts,
                                                    vector< std::vector< float* > > & pointers,
                                                    const Header& header,
                                                    int start,
                                                    int end)
{
    ptrdiff_t width=_dataWindow.size().x+1;
    size_t pixelcount = width * (end-start+1);
    pointers.resize(_channels.size());
    counts.resize(pixelcount);
    buf.insertSampleCountSlice (Slice (OPENEXR_IMF_INTERNAL_NAMESPACE::UINT,
                                (char *) (&counts[0]-_dataWindow.min.x-start*width),
                                sizeof(unsigned int),
                                sizeof(unsigned int)*width));

    pointers[0].resize(pixelcount);
    buf.insert ("Z", DeepSlice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
                                (char *)(&pointers[0][0]-_dataWindow.min.x-start*width),
                                sizeof(float *),
                                sizeof(float *)*width,
                                sizeof(float) ));

    if(_zback)
    {
        pointers[1].resize(pixelcount);
        buf.insert ("ZBack", DeepSlice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
                                        (char *)(&pointers[1][0]-_dataWindow.min.x-start*width),
                                        sizeof(float *),
                                        sizeof(float *)*width,
                                        sizeof(float) ));
    }

    pointers[2].resize(pixelcount);
    buf.insert ("A", DeepSlice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
                                (char *)(&pointers[2][0]-_dataWindow.min.x-start*width),
                                sizeof(float *),
                                sizeof(float *)*width,
                                sizeof(float) ));


    size_t i =0;
    for(FrameBuffer::ConstIterator qt  = _outputFrameBuffer.begin();
                                   qt != _outputFrameBuffer.end();
                                   qt++)
    {
        int channel_in_source = _bufferMap[i];
        if(channel_in_source>2)
        {
            // not dealt with yet (0,1,2 previously inserted)
            pointers[channel_in_source].resize(pixelcount);
            buf.insert (qt.name(),
                        DeepSlice (OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT,
                                   (char *)(&pointers[channel_in_source][0]-_dataWindow.min.x-start*width),
                                   sizeof(float *),
                                   sizeof(float *)*width,
                                   sizeof(float) ));
        }

        i++;
    }

}